

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Segment::PreloadCluster(Segment *this,Cluster *pCluster,ptrdiff_t idx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Cluster **ppCVar4;
  long lVar5;
  Cluster **ppCVar6;
  ulong uVar7;
  
  if (((pCluster != (Cluster *)0x0) && (pCluster->m_index < 0)) &&
     (lVar2 = this->m_clusterCount, lVar2 <= idx)) {
    lVar3 = this->m_clusterPreloadCount;
    lVar5 = this->m_clusterSize;
    lVar1 = lVar3 + lVar2;
    if (lVar1 <= lVar5) {
      if (lVar5 <= lVar1) {
        uVar7 = 0x800;
        if (0 < lVar5) {
          uVar7 = lVar5 * 2;
        }
        ppCVar4 = (Cluster **)
                  operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8,(nothrow_t *)&std::nothrow
                                );
        if (ppCVar4 == (Cluster **)0x0) {
          return false;
        }
        ppCVar6 = this->m_clusters;
        if (lVar1 != 0) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)ppCVar4 + lVar5) = *(undefined8 *)((long)ppCVar6 + lVar5);
            lVar5 = lVar5 + 8;
          } while (lVar3 * 8 + lVar2 * 8 != lVar5);
        }
        if (ppCVar6 != (Cluster **)0x0) {
          operator_delete__(ppCVar6);
        }
        this->m_clusters = ppCVar4;
        this->m_clusterSize = uVar7;
      }
      ppCVar4 = this->m_clusters;
      if (ppCVar4 != (Cluster **)0x0) {
        if (lVar1 < idx) {
          return false;
        }
        if (lVar1 < this->m_clusterSize) {
          ppCVar6 = ppCVar4 + lVar1;
          while( true ) {
            if (ppCVar6 <= ppCVar4 + idx) {
              this->m_clusters[idx] = pCluster;
              this->m_clusterPreloadCount = this->m_clusterPreloadCount + 1;
              return true;
            }
            if (-1 < ppCVar6[-1]->m_index) break;
            *ppCVar6 = ppCVar6[-1];
            ppCVar6 = ppCVar6 + -1;
          }
          return false;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool Segment::PreloadCluster(Cluster* pCluster, ptrdiff_t idx) {
  if (pCluster == NULL || pCluster->m_index >= 0 || idx < m_clusterCount)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  if (size < count)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;
    Cluster** q = qq;

    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusters == NULL)
    return false;

  Cluster** const p = m_clusters + idx;

  Cluster** q = m_clusters + count;
  if (q < p || q >= (m_clusters + size))
    return false;

  while (q > p) {
    Cluster** const qq = q - 1;

    if ((*qq)->m_index >= 0)
      return false;

    *q = *qq;
    q = qq;
  }

  m_clusters[idx] = pCluster;
  ++m_clusterPreloadCount;
  return true;
}